

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O3

GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::operator=(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            *this,GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  *rhs)

{
  char *pcVar1;
  size_t sVar2;
  Ch *pCVar3;
  size_t sVar4;
  
  if (this != rhs) {
    if (this->scheme_ != (Ch *)0x0) {
      free(this->scheme_);
      this->scheme_ = (Ch *)0x0;
    }
    if (rhs->uri_ == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(rhs->uri_);
      sVar4 = sVar2 & 0xffffffff;
    }
    Allocate(this,sVar4);
    pCVar3 = this->scheme_;
    pcVar1 = rhs->scheme_;
    if (pcVar1 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar1);
      sVar4 = sVar2 & 0xffffffff;
    }
    pCVar3 = CopyPart(this,pCVar3,pcVar1,sVar4);
    this->auth_ = pCVar3;
    pcVar1 = rhs->auth_;
    if (pcVar1 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar1);
      sVar4 = sVar2 & 0xffffffff;
    }
    pCVar3 = CopyPart(this,pCVar3,pcVar1,sVar4);
    this->path_ = pCVar3;
    pcVar1 = rhs->path_;
    if (pcVar1 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar1);
      sVar4 = sVar2 & 0xffffffff;
    }
    pCVar3 = CopyPart(this,pCVar3,pcVar1,sVar4);
    this->query_ = pCVar3;
    pcVar1 = rhs->query_;
    if (pcVar1 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar1);
      sVar4 = sVar2 & 0xffffffff;
    }
    pCVar3 = CopyPart(this,pCVar3,pcVar1,sVar4);
    this->frag_ = pCVar3;
    pcVar1 = rhs->frag_;
    if (pcVar1 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar1);
      sVar4 = sVar2 & 0xffffffff;
    }
    pCVar3 = CopyPart(this,pCVar3,pcVar1,sVar4);
    this->base_ = pCVar3;
    pcVar1 = rhs->base_;
    if (pcVar1 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar1);
      sVar4 = sVar2 & 0xffffffff;
    }
    pCVar3 = CopyPart(this,pCVar3,pcVar1,sVar4);
    this->uri_ = pCVar3;
    pcVar1 = rhs->uri_;
    if (pcVar1 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar1);
      sVar4 = sVar2 & 0xffffffff;
    }
    CopyPart(this,pCVar3,pcVar1,sVar4);
  }
  return this;
}

Assistant:

GenericUri& operator=(const GenericUri& rhs) {
        if (this != &rhs) {
            // Do not delete ownAllocator
            Free();
            Allocate(rhs.GetStringLength());
            auth_ = CopyPart(scheme_, rhs.scheme_, rhs.GetSchemeStringLength());
            path_ = CopyPart(auth_, rhs.auth_, rhs.GetAuthStringLength());
            query_ = CopyPart(path_, rhs.path_, rhs.GetPathStringLength());
            frag_ = CopyPart(query_, rhs.query_, rhs.GetQueryStringLength());
            base_ = CopyPart(frag_, rhs.frag_, rhs.GetFragStringLength());
            uri_ = CopyPart(base_, rhs.base_, rhs.GetBaseStringLength());
            CopyPart(uri_, rhs.uri_, rhs.GetStringLength());
        }
        return *this;
    }